

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal.cpp
# Opt level: O0

void __thiscall unodb::detail::dump_val(detail *this,ostream *os,value_view v)

{
  size_type sVar1;
  ostream *poVar2;
  reference peVar3;
  size_type local_30;
  size_t i;
  size_type sz;
  ostream *os_local;
  value_view v_local;
  
  v_local._M_ptr = v._M_ptr;
  os_local = os;
  sVar1 = std::span<const_std::byte,_18446744073709551615UL>::size_bytes
                    ((span<const_std::byte,_18446744073709551615UL> *)&os_local);
  poVar2 = std::operator<<((ostream *)this,"val(");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar1);
  std::operator<<(poVar2,"): 0x");
  for (local_30 = 0; local_30 < sVar1; local_30 = local_30 + 1) {
    peVar3 = std::span<const_std::byte,_18446744073709551615UL>::operator[]
                       ((span<const_std::byte,_18446744073709551615UL> *)&os_local,local_30);
    dump_byte((ostream *)this,*peVar3);
  }
  return;
}

Assistant:

[[gnu::cold]] UNODB_DETAIL_NOINLINE void dump_val(std::ostream &os,
                                                  unodb::value_view v) {
  const auto sz = v.size_bytes();
  os << "val(" << sz << "): 0x";
  for (std::size_t i = 0; i < sz; ++i) dump_byte(os, v[i]);
}